

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void dwt_interleave_h(dwt_t *h,int *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *ai;
  long lVar5;
  
  piVar4 = h->mem;
  iVar1 = h->cas;
  iVar2 = h->sn;
  for (lVar5 = 0; iVar2 != (int)lVar5; lVar5 = lVar5 + 1) {
    piVar4[(long)iVar1 + lVar5 * 2] = a[lVar5];
  }
  iVar1 = h->sn;
  iVar2 = h->cas;
  iVar3 = h->dn;
  for (lVar5 = 0; iVar3 != (int)lVar5; lVar5 = lVar5 + 1) {
    piVar4[(lVar5 * 2 + 1) - (long)iVar2] = a[iVar1 + lVar5];
  }
  return;
}

Assistant:

static void dwt_interleave_h(dwt_t* h, int *a) {
    int *ai = a;
    int *bi = h->mem + h->cas;
    int  i	= h->sn;
    while( i-- ) {
      *bi = *(ai++);
	  bi += 2;
    }
    ai	= a + h->sn;
    bi	= h->mem + 1 - h->cas;
    i	= h->dn ;
    while( i-- ) {
      *bi = *(ai++);
	  bi += 2;
    }
}